

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

uint __thiscall ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_OutlineFigure *this,ON_2fPoint *p)

{
  bool bVar1;
  float fVar2;
  ON_OutlineFigurePoint *pOVar3;
  float local_60;
  ON_2fPoint OStack_5c;
  uint i_2;
  ON_2fPoint candidate_p_2;
  ON__UINT32 i_1;
  ON_2fPoint candidate_p_1;
  ON_2fPoint candidate_p;
  ON__UINT32 i;
  uint i1;
  ON_2fPoint prev_p;
  ON_2fPoint p0;
  ON__UINT32 end_dex;
  uint point_count;
  ON_2fPoint *p_local;
  ON_OutlineFigure *this_local;
  
  if (p == (ON_2fPoint *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    p0.y = 0.0;
    fVar2 = (float)Internal_FigureEndDex(this,false);
    if (fVar2 != 0.0) {
      pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this->m_points,0);
      _i = pOVar3->m_point;
      p0.y = 1.4013e-45;
      *p = _i;
      candidate_p.y = (float)((uint)fVar2 >> 1);
      prev_p = _i;
      candidate_p.x = candidate_p.y;
      if (1 < (uint)candidate_p.y) {
        do {
          do {
            candidate_p.x = (float)((int)candidate_p.x - 1);
            if (candidate_p.x == 0.0) goto LAB_006491df;
            pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                               (&this->m_points,(uint)candidate_p.x);
            bVar1 = ON_OutlineFigurePoint::IsOnFigure(pOVar3);
          } while (!bVar1);
          pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                             (&this->m_points,(uint)candidate_p.x);
          candidate_p_1 = pOVar3->m_point;
          bVar1 = ON_2fPoint::operator!=((ON_2fPoint *)&i,&candidate_p_1);
        } while (!bVar1);
        _i = candidate_p_1;
        p0.y = 2.8026e-45;
        p[1] = candidate_p_1;
      }
LAB_006491df:
      do {
        candidate_p_2.x = fVar2;
        if ((uint)fVar2 < (uint)candidate_p.y) goto LAB_00649274;
        pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                           (&this->m_points,(uint)candidate_p.y);
        bVar1 = ON_OutlineFigurePoint::IsOnFigure(pOVar3);
        if (bVar1) {
          pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                             (&this->m_points,(uint)candidate_p.y);
          unique0x00012000 = pOVar3->m_point;
          bVar1 = ON_2fPoint::operator!=((ON_2fPoint *)&i,(ON_2fPoint *)&candidate_p_2.y);
          if (bVar1) {
            _i = stack0xffffffffffffffb0;
            p[(uint)p0.y] = stack0xffffffffffffffb0;
            p0.y = (float)((int)p0.y + 1);
            goto LAB_00649274;
          }
        }
        candidate_p.y = (float)((int)candidate_p.y + 1);
      } while( true );
    }
LAB_00649310:
    for (local_60 = p0.y; (uint)local_60 < 4; local_60 = (float)((int)local_60 + 1)) {
      p[(uint)local_60] = ON_2fPoint::NanPoint;
    }
    this_local._4_4_ = p0.y;
  }
  return (uint)this_local._4_4_;
LAB_00649274:
  if ((uint)candidate_p_2.x <= (uint)candidate_p.y) goto LAB_00649310;
  pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this->m_points,(uint)candidate_p_2.x);
  bVar1 = ON_OutlineFigurePoint::IsOnFigure(pOVar3);
  if (bVar1) {
    pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[]
                       (&this->m_points,(uint)candidate_p_2.x);
    OStack_5c = pOVar3->m_point;
    bVar1 = ON_2fPoint::operator!=((ON_2fPoint *)&i,&stack0xffffffffffffffa4);
    if ((bVar1) && (bVar1 = ON_2fPoint::operator!=(&prev_p,&stack0xffffffffffffffa4), bVar1)) {
      p[(uint)p0.y] = OStack_5c;
      p0.y = (float)((int)p0.y + 1);
      goto LAB_00649310;
    }
  }
  candidate_p_2.x = (float)((int)candidate_p_2.x + -1);
  goto LAB_00649274;
}

Assistant:

unsigned ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_2fPoint p[4]) const
{
  if (nullptr == p)
    return 0;
  
  unsigned point_count = 0;
  const ON__UINT32 end_dex = Internal_FigureEndDex(false);
  if (end_dex > 0)
  {
    // p[0] = point at the start
    const ON_2fPoint p0 = this->m_points[0].m_point;
    p[point_count++] = p0;


    // p[1] = point between start and middle
    ON_2fPoint prev_p = p0;
    unsigned i1 = end_dex / 2;
    if (i1 >= 2)
    {
      for (ON__UINT32 i = i1 - 1; i > 0; --i)
      {
        if (false == this->m_points[i].IsOnFigure())
          continue;
        const ON_2fPoint candidate_p = this->m_points[i].m_point;
        if (prev_p != candidate_p)
        {
          prev_p = candidate_p;
          p[point_count++] = candidate_p;
          break;
        }
      }
    }

    // p[2] = point between middle and end
    for (/*empty init*/; i1 <= end_dex; ++i1)
    {
      if (false == this->m_points[i1].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i1].m_point;
      if (prev_p != candidate_p)
      {
        prev_p = candidate_p;
        p[point_count++] = candidate_p;
        break;
      }
    }

    // p[3] = point close to end
    for (ON__UINT32 i = end_dex; i > i1; --i)
    {
      if (false == this->m_points[i].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i].m_point;
      if (prev_p != candidate_p && p0 != candidate_p)
      {
        p[point_count++] = candidate_p;
        break;
      }
    }
  }

  for (unsigned i = point_count; i < 4; ++i)
    p[i] = ON_2fPoint::NanPoint;
  return point_count;
}